

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmValue __thiscall cmState::GetGlobalProperty(cmState *this,string *prop)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *local_290;
  char *local_280;
  allocator<char> local_252;
  allocator<char> local_251;
  allocator<char> local_250;
  allocator<char> local_24f;
  allocator<char> local_24e;
  allocator<char> local_24d;
  allocator<char> local_24c;
  allocator<char> local_24b;
  allocator<char> local_24a;
  allocator<char> local_249;
  string local_248;
  undefined1 local_228 [8];
  string mode;
  string local_200;
  string_view local_1e0;
  string_view local_1d0;
  string local_1c0;
  string local_1a0 [8];
  string langs;
  string local_178;
  allocator<char> local_151;
  string local_150;
  string_view local_130;
  string_view local_120;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string_view local_a0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cacheKeys;
  string *prop_local;
  cmState *this_local;
  
  cacheKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = prop;
  bVar1 = std::operator==(prop,"CACHE_VARIABLES");
  if (bVar1) {
    GetCacheEntryKeys_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"CACHE_VARIABLES",&local_59);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,";");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               &commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmJoin(&local_90,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38,local_a0,stack0xffffffffffffff50);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    SetGlobalProperty(this,&local_58,pcVar3);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
  }
  else {
    bVar1 = std::operator==(cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"COMMANDS");
    if (bVar1) {
      GetCommandNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c8,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"COMMANDS",&local_e9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_120,";");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_130);
      cmJoin(&local_110,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c8,local_120,local_130);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      SetGlobalProperty(this,&local_e8,pcVar3);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c8);
    }
    else {
      bVar1 = std::operator==(cacheKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,"IN_TRY_COMPILE");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"IN_TRY_COMPILE",&local_151);
        if (this->StateProjectKind == TryCompile) {
          local_280 = "1";
        }
        else {
          local_280 = "0";
        }
        SetGlobalProperty(this,&local_150,local_280);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator(&local_151);
      }
      else {
        bVar1 = std::operator==(cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "GENERATOR_IS_MULTI_CONFIG");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_178,"GENERATOR_IS_MULTI_CONFIG",
                     (allocator<char> *)(langs.field_2._M_local_buf + 0xf));
          if ((this->IsGeneratorMultiConfig & 1U) == 0) {
            local_290 = "0";
          }
          else {
            local_290 = "1";
          }
          SetGlobalProperty(this,&local_178,local_290);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator((allocator<char> *)(langs.field_2._M_local_buf + 0xf));
        }
        else {
          bVar1 = std::operator==(cacheKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "ENABLED_LANGUAGES");
          if (bVar1) {
            std::__cxx11::string::string(local_1a0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,";")
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0);
            cmJoin(&local_1c0,&this->EnabledLanguages,local_1d0,local_1e0);
            std::__cxx11::string::operator=(local_1a0,(string *)&local_1c0);
            std::__cxx11::string::~string((string *)&local_1c0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_200,"ENABLED_LANGUAGES",
                       (allocator<char> *)(mode.field_2._M_local_buf + 0xf));
            pcVar3 = (char *)std::__cxx11::string::c_str();
            SetGlobalProperty(this,&local_200,pcVar3);
            std::__cxx11::string::~string((string *)&local_200);
            std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
            std::__cxx11::string::~string(local_1a0);
          }
          else {
            bVar1 = std::operator==(cacheKeys.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"CMAKE_ROLE")
            ;
            if (bVar1) {
              GetModeString_abi_cxx11_((string *)local_228,this);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_248,"CMAKE_ROLE",&local_249);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              SetGlobalProperty(this,&local_248,pcVar3);
              std::__cxx11::string::~string((string *)&local_248);
              std::allocator<char>::~allocator(&local_249);
              std::__cxx11::string::~string((string *)local_228);
            }
          }
        }
      }
    }
  }
  bVar1 = std::operator==(cacheKeys.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          "CMAKE_C_KNOWN_FEATURES");
  if (bVar1) {
    if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                 "c_std_90;c_std_99;c_std_11;c_std_17;c_std_23;c_function_prototypes;c_restrict;c_variadic_macros;c_static_assert"
                 ,&local_24a);
      std::allocator<char>::~allocator(&local_24a);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
    }
    cmValue::cmValue((cmValue *)&this_local,
                     &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
  }
  else {
    bVar1 = std::operator==(cacheKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            "CMAKE_C90_KNOWN_FEATURES");
    if (bVar1) {
      if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                       s_out_abi_cxx11_), iVar2 != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                   "c_function_prototypes",&local_24b);
        std::allocator<char>::~allocator(&local_24b);
        __cxa_atexit(std::__cxx11::string::~string,
                     &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,&__dso_handle
                    );
        __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
      }
      cmValue::cmValue((cmValue *)&this_local,
                       &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
    }
    else {
      bVar1 = std::operator==(cacheKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              "CMAKE_C99_KNOWN_FEATURES");
      if (bVar1) {
        if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
           (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                         s_out_abi_cxx11_), iVar2 != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                     "c_restrict;c_variadic_macros",&local_24c);
          std::allocator<char>::~allocator(&local_24c);
          __cxa_atexit(std::__cxx11::string::~string,
                       &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                       &__dso_handle);
          __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
        }
        cmValue::cmValue((cmValue *)&this_local,
                         &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
      }
      else {
        bVar1 = std::operator==(cacheKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                "CMAKE_C11_KNOWN_FEATURES");
        if (bVar1) {
          if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
             (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                           s_out_abi_cxx11_), iVar2 != 0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                       "c_static_assert",&local_24d);
            std::allocator<char>::~allocator(&local_24d);
            __cxa_atexit(std::__cxx11::string::~string,
                         &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                         &__dso_handle);
            __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
          }
          cmValue::cmValue((cmValue *)&this_local,
                           &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
        }
        else {
          bVar1 = std::operator==(cacheKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  "CMAKE_CXX_KNOWN_FEATURES");
          if (bVar1) {
            if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
               (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                             s_out_abi_cxx11_), iVar2 != 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_
                         ,
                         "cxx_std_98;cxx_std_11;cxx_std_14;cxx_std_17;cxx_std_20;cxx_std_23;cxx_std_26;cxx_template_template_parameters;cxx_alias_templates;cxx_alignas;cxx_alignof;cxx_attributes;cxx_auto_type;cxx_constexpr;cxx_decltype;cxx_decltype_incomplete_return_types;cxx_default_function_template_args;cxx_defaulted_functions;cxx_defaulted_move_initializers;cxx_delegating_constructors;cxx_deleted_functions;cxx_enum_forward_declarations;cxx_explicit_conversions;cxx_extended_friend_declarations;cxx_extern_templates;cxx_final;cxx_func_identifier;cxx_generalized_initializers;cxx_inheriting_constructors;cxx_inline_namespaces;cxx_lambdas;cxx_local_type_template_args;cxx_long_long_type;cxx_noexcept;cxx_nonstatic_member_init;cxx_nullptr;cxx_override;cxx_range_for;cxx_raw_string_literals;cxx_reference_qualified_functions;cxx_right_angle_brackets;cxx_rvalue_references;cxx_sizeof_member;cxx_static_assert;cxx_strong_enums;cxx_thread_local;cxx_trailing_return_types;cxx_unicode_literals;cxx_uniform_initialization;cxx_unrestricted_unions;cxx_user_literals;cxx_variadic_macros;cxx_variadic_templates;cxx_aggregate_default_initializers;cxx_attribute_deprecated;cxx_binary_literals;cxx_contextual_conversions;cxx_decltype_auto;cxx_digit_separators;cxx_generic_lambdas;cxx_lambda_init_captures;cxx_relaxed_constexpr;cxx_return_type_deduction;cxx_variable_templates"
                         ,&local_24e);
              std::allocator<char>::~allocator(&local_24e);
              __cxa_atexit(std::__cxx11::string::~string,
                           &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                           &__dso_handle);
              __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_)
              ;
            }
            cmValue::cmValue((cmValue *)&this_local,
                             &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
          }
          else {
            bVar1 = std::operator==(cacheKeys.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    "CMAKE_CXX98_KNOWN_FEATURES");
            if (bVar1) {
              if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
                 (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                               s_out_abi_cxx11_), iVar2 != 0)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)
                           &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                           "cxx_template_template_parameters",&local_24f);
                std::allocator<char>::~allocator(&local_24f);
                __cxa_atexit(std::__cxx11::string::~string,
                             &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                             &__dso_handle);
                __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::
                                     s_out_abi_cxx11_);
              }
              cmValue::cmValue((cmValue *)&this_local,
                               &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
            }
            else {
              bVar1 = std::operator==(cacheKeys.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      "CMAKE_CXX11_KNOWN_FEATURES");
              if (bVar1) {
                if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
                   (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                                 s_out_abi_cxx11_), iVar2 != 0)) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)
                             &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                             "cxx_alias_templates;cxx_alignas;cxx_alignof;cxx_attributes;cxx_auto_type;cxx_constexpr;cxx_decltype;cxx_decltype_incomplete_return_types;cxx_default_function_template_args;cxx_defaulted_functions;cxx_defaulted_move_initializers;cxx_delegating_constructors;cxx_deleted_functions;cxx_enum_forward_declarations;cxx_explicit_conversions;cxx_extended_friend_declarations;cxx_extern_templates;cxx_final;cxx_func_identifier;cxx_generalized_initializers;cxx_inheriting_constructors;cxx_inline_namespaces;cxx_lambdas;cxx_local_type_template_args;cxx_long_long_type;cxx_noexcept;cxx_nonstatic_member_init;cxx_nullptr;cxx_override;cxx_range_for;cxx_raw_string_literals;cxx_reference_qualified_functions;cxx_right_angle_brackets;cxx_rvalue_references;cxx_sizeof_member;cxx_static_assert;cxx_strong_enums;cxx_thread_local;cxx_trailing_return_types;cxx_unicode_literals;cxx_uniform_initialization;cxx_unrestricted_unions;cxx_user_literals;cxx_variadic_macros;cxx_variadic_templates"
                             ,&local_250);
                  std::allocator<char>::~allocator(&local_250);
                  __cxa_atexit(std::__cxx11::string::~string,
                               &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                               &__dso_handle);
                  __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::
                                       s_out_abi_cxx11_);
                }
                cmValue::cmValue((cmValue *)&this_local,
                                 &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_);
              }
              else {
                bVar1 = std::operator==(cacheKeys.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                        "CMAKE_CXX14_KNOWN_FEATURES");
                if (bVar1) {
                  if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0') &&
                     (iVar2 = __cxa_guard_acquire(&GetGlobalProperty(std::__cxx11::string_const&)::
                                                   s_out_abi_cxx11_), iVar2 != 0)) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)
                               &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                               "cxx_aggregate_default_initializers;cxx_attribute_deprecated;cxx_binary_literals;cxx_contextual_conversions;cxx_decltype_auto;cxx_digit_separators;cxx_generic_lambdas;cxx_lambda_init_captures;cxx_relaxed_constexpr;cxx_return_type_deduction;cxx_variable_templates"
                               ,&local_251);
                    std::allocator<char>::~allocator(&local_251);
                    __cxa_atexit(std::__cxx11::string::~string,
                                 &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                                 &__dso_handle);
                    __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::
                                         s_out_abi_cxx11_);
                  }
                  cmValue::cmValue((cmValue *)&this_local,
                                   &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_
                                  );
                }
                else {
                  bVar1 = std::operator==(cacheKeys.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                          "CMAKE_CUDA_KNOWN_FEATURES");
                  if (bVar1) {
                    if ((GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_ == '\0')
                       && (iVar2 = __cxa_guard_acquire(&
                                                  GetGlobalProperty(std::__cxx11::string_const&)::
                                                  s_out_abi_cxx11_), iVar2 != 0)) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)
                                 &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_,
                                 "cuda_std_03;cuda_std_11;cuda_std_14;cuda_std_17;cuda_std_20;cuda_std_23;cuda_std_26"
                                 ,&local_252);
                      std::allocator<char>::~allocator(&local_252);
                      __cxa_atexit(std::__cxx11::string::~string,
                                   &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_
                                   ,&__dso_handle);
                      __cxa_guard_release(&GetGlobalProperty(std::__cxx11::string_const&)::
                                           s_out_abi_cxx11_);
                    }
                    cmValue::cmValue((cmValue *)&this_local,
                                     &GetGlobalProperty(std::__cxx11::string_const&)::
                                      s_out_abi_cxx11_);
                  }
                  else {
                    this_local = (cmState *)
                                 cmPropertyMap::GetPropertyValue
                                           (&this->GlobalProperties,
                                            cacheKeys.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmState::GetGlobalProperty(const std::string& prop)
{
  if (prop == "CACHE_VARIABLES") {
    std::vector<std::string> cacheKeys = this->GetCacheEntryKeys();
    this->SetGlobalProperty("CACHE_VARIABLES", cmJoin(cacheKeys, ";").c_str());
  } else if (prop == "COMMANDS") {
    std::vector<std::string> commands = this->GetCommandNames();
    this->SetGlobalProperty("COMMANDS", cmJoin(commands, ";").c_str());
  } else if (prop == "IN_TRY_COMPILE") {
    this->SetGlobalProperty(
      "IN_TRY_COMPILE",
      this->StateProjectKind == ProjectKind::TryCompile ? "1" : "0");
  } else if (prop == "GENERATOR_IS_MULTI_CONFIG") {
    this->SetGlobalProperty("GENERATOR_IS_MULTI_CONFIG",
                            this->IsGeneratorMultiConfig ? "1" : "0");
  } else if (prop == "ENABLED_LANGUAGES") {
    std::string langs;
    langs = cmJoin(this->EnabledLanguages, ";");
    this->SetGlobalProperty("ENABLED_LANGUAGES", langs.c_str());
  } else if (prop == "CMAKE_ROLE") {
    std::string mode = this->GetModeString();
    this->SetGlobalProperty("CMAKE_ROLE", mode.c_str());
  }
#define STRING_LIST_ELEMENT(F) ";" #F
  if (prop == "CMAKE_C_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_C90_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C90_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_C99_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C99_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_C11_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_C11_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX98_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX98_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX11_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX11_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CXX14_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CXX14_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }
  if (prop == "CMAKE_CUDA_KNOWN_FEATURES") {
    static const std::string s_out(
      &FOR_EACH_CUDA_FEATURE(STRING_LIST_ELEMENT)[1]);
    return cmValue(s_out);
  }

#undef STRING_LIST_ELEMENT
  return this->GlobalProperties.GetPropertyValue(prop);
}